

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O3

CURLcode Curl_connect(Curl_easy *data,connectdata **in_connect,_Bool *asyncp,_Bool *protocol_done)

{
  curl_proxytype cVar1;
  uint uVar2;
  void *pvVar3;
  _Bool *first;
  bool bVar4;
  _Bool _Var5;
  byte bVar6;
  char cVar7;
  CURLcode CVar8;
  int iVar9;
  CURLcode CVar10;
  Curl_easy *pCVar11;
  size_t sVar12;
  connectdata *pcVar13;
  char *pcVar14;
  size_t sVar15;
  char *pcVar16;
  char *pcVar17;
  long lVar18;
  undefined8 uVar19;
  size_t sVar20;
  byte *pbVar21;
  byte *pbVar22;
  ulong uVar23;
  connectdata *pcVar24;
  Curl_handler **ppCVar25;
  char *pcVar26;
  conncache *pcVar27;
  char **optionsp_00;
  Curl_handler *pCVar28;
  timeval tVar29;
  _Bool waitpipe;
  _Bool force_reuse;
  char *options;
  char *passwd;
  char *user;
  char slashbuf [4];
  char *newname;
  char *optionsp;
  char *passwdp;
  connectdata *conn_temp;
  char protobuf [16];
  _Bool local_d2;
  _Bool local_d1;
  _Bool *local_d0;
  connectdata **local_c8;
  undefined4 local_bc;
  _Bool *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  Curl_easy *local_88;
  byte *local_80;
  size_t local_78;
  char *local_70;
  char *local_68;
  size_t local_60;
  _Bool *local_58;
  connectdata *local_50;
  _Bool local_48 [24];
  
  *asyncp = false;
  local_50 = (connectdata *)0x0;
  local_a0 = (char *)0x0;
  local_a8 = (char *)0x0;
  local_b0 = (char *)0x0;
  local_d1 = false;
  local_d2 = false;
  pCVar11 = (Curl_easy *)Curl_multi_max_host_connections(data->multi);
  sVar12 = Curl_multi_max_total_connections(data->multi);
  *asyncp = false;
  local_58 = asyncp;
  if ((data->change).url == (char *)0x0) {
    CVar8 = CURLE_URL_MALFORMAT;
    goto LAB_0050b5ae;
  }
  local_88 = pCVar11;
  local_78 = sVar12;
  pcVar13 = (connectdata *)(*Curl_ccalloc)(1,0x760);
  CVar8 = CURLE_OUT_OF_MEMORY;
  if (pcVar13 == (connectdata *)0x0) goto LAB_0050b5ae;
  pcVar13->handler = &Curl_handler_dummy;
  pcVar13->connection_id = -1;
  pcVar13->port = -1;
  pcVar13->remote_port = -1;
  pcVar13->sock[0] = -1;
  pcVar13->sock[1] = -1;
  pcVar13->tempsock[0] = -1;
  pcVar13->tempsock[1] = -1;
  Curl_conncontrol(pcVar13,1);
  tVar29 = curlx_tvnow();
  pcVar13->created = tVar29;
  pcVar13->data = data;
  cVar1 = (data->set).proxytype;
  (pcVar13->http_proxy).proxytype = cVar1;
  (pcVar13->socks_proxy).proxytype = CURLPROXY_SOCKS4;
  pcVar17 = (data->set).str[0x15];
  if (pcVar17 == (char *)0x0) {
    (pcVar13->bits).proxy = false;
LAB_0050b286:
    (pcVar13->bits).httpproxy = false;
    bVar4 = false;
  }
  else {
    cVar7 = *pcVar17;
    (pcVar13->bits).proxy = cVar7 != '\0';
    if (cVar7 == '\0') goto LAB_0050b286;
    bVar4 = cVar1 >= (CURLPROXY_HTTPS|CURLPROXY_HTTP_1_0);
    (pcVar13->bits).httpproxy = cVar1 < (CURLPROXY_HTTPS|CURLPROXY_HTTP_1_0);
  }
  (pcVar13->bits).socksproxy = bVar4;
  pcVar14 = (data->set).str[0x16];
  if ((pcVar14 != (char *)0x0) && (*pcVar14 != '\0')) {
    (pcVar13->bits).proxy = true;
    (pcVar13->bits).socksproxy = true;
  }
  (pcVar13->bits).proxy_user_passwd = (data->set).str[0x2c] != (char *)0x0;
  (pcVar13->bits).tunnel_proxy = (data->set).tunnel_thru_httpproxy;
  (pcVar13->bits).user_passwd = (data->set).str[0x29] != (char *)0x0;
  (pcVar13->bits).ftp_use_epsv = (data->set).ftp_use_epsv;
  (pcVar13->bits).ftp_use_eprt = (data->set).ftp_use_eprt;
  (pcVar13->ssl_config).verifystatus = (data->set).ssl.primary.verifystatus;
  (pcVar13->ssl_config).verifypeer = (data->set).ssl.primary.verifypeer;
  (pcVar13->ssl_config).verifyhost = (data->set).ssl.primary.verifyhost;
  (pcVar13->proxy_ssl_config).verifystatus = (data->set).proxy_ssl.primary.verifystatus;
  (pcVar13->proxy_ssl_config).verifypeer = (data->set).proxy_ssl.primary.verifypeer;
  (pcVar13->proxy_ssl_config).verifyhost = (data->set).proxy_ssl.primary.verifyhost;
  pcVar13->ip_version = (data->set).ipver;
  _Var5 = Curl_pipeline_wanted(data->multi,1);
  if ((_Var5) && (pcVar13->master_buffer == (char *)0x0)) {
    pcVar14 = (char *)(*Curl_ccalloc)(0x4000,1);
    pcVar13->master_buffer = pcVar14;
    if (pcVar14 != (char *)0x0) goto LAB_0050b3b0;
LAB_0050b549:
    Curl_llist_destroy(&pcVar13->send_pipe,(void *)0x0);
    Curl_llist_destroy(&pcVar13->recv_pipe,(void *)0x0);
    (*Curl_cfree)(pcVar13->master_buffer);
    (*Curl_cfree)(pcVar13->localdev);
    (*Curl_cfree)(pcVar13);
  }
  else {
LAB_0050b3b0:
    Curl_llist_init(&pcVar13->send_pipe,llist_dtor);
    Curl_llist_init(&pcVar13->recv_pipe,llist_dtor);
    pcVar14 = (data->set).str[8];
    if (pcVar14 != (char *)0x0) {
      pcVar14 = (*Curl_cstrdup)(pcVar14);
      pcVar13->localdev = pcVar14;
      if (pcVar14 == (char *)0x0) goto LAB_0050b549;
    }
    pcVar13->localportrange = (data->set).localportrange;
    pcVar13->localport = (data->set).localport;
    pvVar3 = (data->set).closesocket_client;
    pcVar13->fclosesocket = (data->set).fclosesocket;
    pcVar13->closesocket_client = pvVar3;
    *in_connect = pcVar13;
    sVar15 = strlen((data->change).url);
    sVar20 = 0x100;
    if (0x100 < sVar15) {
      sVar20 = sVar15;
    }
    (*Curl_cfree)((data->state).pathbuffer);
    (data->state).pathbuffer = (char *)0x0;
    (data->state).path = (char *)0x0;
    pcVar14 = (char *)(*Curl_cmalloc)(sVar20 + 2);
    (data->state).pathbuffer = pcVar14;
    if (pcVar14 != (char *)0x0) {
      (data->state).path = pcVar14;
      pcVar14 = (char *)(*Curl_cmalloc)(sVar20 + 2);
      (pcVar13->host).rawalloc = pcVar14;
      if (pcVar14 == (char *)0x0) {
        (*Curl_cfree)((data->state).pathbuffer);
        (data->state).pathbuffer = (char *)0x0;
        (data->state).path = (char *)0x0;
      }
      else {
        (pcVar13->host).name = pcVar14;
        *pcVar14 = '\0';
        pcVar26 = "";
        local_d0 = protocol_done;
        local_c8 = in_connect;
        pcVar14 = (*Curl_cstrdup)("");
        local_a0 = pcVar14;
        pcVar16 = (*Curl_cstrdup)("");
        local_a8 = pcVar16;
        local_b0 = (*Curl_cstrdup)("");
        uVar19 = CONCAT71((int7)((ulong)pcVar17 >> 8),pcVar14 != (char *)0x0);
        in_connect = local_c8;
        protocol_done = local_d0;
        if (local_b0 != (char *)0x0 && (pcVar16 != (char *)0x0 && pcVar14 != (char *)0x0)) {
          pbVar22 = (byte *)(data->state).path;
          pbVar21 = (byte *)(data->change).url;
          pcVar17 = strpbrk((char *)pbVar21,"\r\n");
          protocol_done = local_d0;
          if (pcVar17 == (char *)0x0) {
            if (*pbVar21 != 0x3a) {
              if ((((byte)((*pbVar21 & 0xdf) + 0xbf) < 0x1a) && (pbVar21[1] == 0x3a)) &&
                 (pcVar17 = (data->set).str[7], pcVar17 != (char *)0x0)) {
                iVar9 = Curl_strcasecompare(pcVar17,"file");
                if (iVar9 == 0) {
                  pbVar21 = (byte *)(data->change).url;
                  goto LAB_0050b68e;
                }
              }
              else {
LAB_0050b68e:
                lVar18 = 0;
                do {
                  bVar6 = pbVar21[lVar18];
                  uVar19 = 0;
                  if ((bVar6 == 0) || (bVar6 == 0x2f)) break;
                  if (bVar6 == 0x3a) {
                    iVar9 = Curl_strncasecompare((char *)pbVar21,"file:",5);
                    if (iVar9 == 0) goto LAB_0050b7a5;
                    iVar9 = __isoc99_sscanf((data->change).url,"%*15[^\n/:]:%[^\n]",pbVar22);
                    if (iVar9 != 1) goto LAB_0050b7e0;
                    bVar6 = *pbVar22;
                    if (bVar6 != 0x2f) {
                      local_bc = 0;
                      goto LAB_0050b6ff;
                    }
                    if (pbVar22[1] == 0x2f) {
                      sVar20 = strlen((char *)(pbVar22 + 2));
                      memmove(pbVar22,pbVar22 + 2,sVar20 + 1);
                    }
                    local_bc = 0;
                    goto LAB_0050b6fc;
                  }
                  lVar18 = lVar18 + 1;
                } while (lVar18 != 0x10);
              }
              pcVar17 = (data->set).str[7];
              if ((pcVar17 == (char *)0x0) ||
                 (iVar9 = Curl_strcasecompare(pcVar17,"file"), iVar9 == 0)) {
LAB_0050b7a5:
                *pbVar22 = 0;
                local_b8 = local_48;
                iVar9 = __isoc99_sscanf((data->change).url,"%15[^\n/:]:%3[/]%[^\n/?#]%[^\n]",
                                        local_b8,&local_98,(pcVar13->host).name);
                if (iVar9 == 2) goto LAB_0050b7e0;
                if (iVar9 < 3) {
                  uVar19 = __isoc99_sscanf((data->change).url,"%[^\n/?#]%[^\n]",(pcVar13->host).name
                                           ,pbVar22);
                  if (0 < (int)uVar19) {
                    local_b8 = (_Bool *)(data->set).str[7];
                    local_bc = (undefined4)CONCAT71((int7)((ulong)uVar19 >> 8),1);
                    if (local_b8 == (_Bool *)0x0) {
                      iVar9 = curl_strnequal("FTP.",(pcVar13->host).name,4);
                      if (iVar9 == 0) {
                        iVar9 = curl_strnequal("DICT.",(pcVar13->host).name,5);
                        if (iVar9 == 0) {
                          iVar9 = curl_strnequal("LDAP.",(pcVar13->host).name,5);
                          if (iVar9 == 0) {
                            iVar9 = curl_strnequal("IMAP.",(pcVar13->host).name,5);
                            if (iVar9 == 0) {
                              iVar9 = curl_strnequal("SMTP.",(pcVar13->host).name,5);
                              if (iVar9 == 0) {
                                iVar9 = curl_strnequal("POP3.",(pcVar13->host).name,5);
                                local_b8 = (_Bool *)0x5a141a;
                                if (iVar9 == 0) {
                                  local_b8 = (_Bool *)0x588c83;
                                }
                              }
                              else {
                                local_b8 = (_Bool *)0x5a140f;
                              }
                            }
                            else {
                              local_b8 = (_Bool *)0x5a1404;
                            }
                          }
                          else {
                            local_b8 = (_Bool *)0x5a13f9;
                          }
                        }
                        else {
                          local_b8 = (_Bool *)0x5a13ee;
                        }
                      }
                      else {
                        local_b8 = (_Bool *)0x588c88;
                      }
                    }
                    goto LAB_0050baa9;
                  }
                  goto LAB_0050bd8d;
                }
                sVar20 = strlen((char *)&local_98);
                if (sVar20 == 2) {
LAB_0050b903:
                  local_bc = 0;
                  goto LAB_0050baa9;
                }
                if (1 < sVar20) {
                  pcVar26 = "es";
                }
                Curl_infof(data,"Unwillingly accepted illegal URL using %d slash%s!\n",sVar20,
                           pcVar26);
                if ((data->change).url_alloc == true) {
                  (*Curl_cfree)((data->change).url);
                }
                local_b8 = local_48;
                pcVar17 = curl_maprintf("%s://%s%s",local_b8,(pcVar13->host).name,pbVar22);
                (data->change).url = pcVar17;
                if (pcVar17 != (char *)0x0) {
                  (data->change).url_alloc = true;
                  goto LAB_0050b903;
                }
              }
              else {
                iVar9 = __isoc99_sscanf((data->change).url,"%[^\n]",pbVar22);
                local_bc = (undefined4)CONCAT71((int7)((ulong)uVar19 >> 8),1);
                if (iVar9 != 1) {
LAB_0050b7e0:
                  pcVar17 = "Bad URL";
                  goto LAB_0050b7e7;
                }
LAB_0050b6fc:
                bVar6 = *pbVar22;
LAB_0050b6ff:
                if ((byte)((bVar6 & 0xdf) + 0xbf) < 0x1a) {
                  if (bVar6 != 0x2f && pbVar22[1] != 0x3a) goto LAB_0050b925;
                  if (pbVar22[1] != 0x3a) goto LAB_0050b914;
LAB_0050b9a3:
                  Curl_failf(data,"File drive letters are only accepted in MSDOS/Windows.");
                  CVar8 = CURLE_URL_MALFORMAT;
                  in_connect = local_c8;
                  protocol_done = local_d0;
                  goto LAB_0050b5ae;
                }
                if (bVar6 == 0x2f) {
LAB_0050b914:
                  local_b8 = (_Bool *)0x59edc7;
                }
                else {
LAB_0050b925:
                  iVar9 = curl_strnequal("localhost/",(char *)pbVar22,10);
                  if ((iVar9 == 0) &&
                     (iVar9 = curl_strnequal("127.0.0.1/",(char *)pbVar22,10), iVar9 == 0)) {
                    pcVar17 = "Invalid file://hostname/, expected localhost or 127.0.0.1 or none";
                    goto LAB_0050b7e7;
                  }
                  pbVar21 = pbVar22 + 9;
                  if (pbVar22[10] == 0x2f) {
                    pbVar21 = pbVar22 + 10;
                  }
                  sVar20 = strlen((char *)pbVar21);
                  memmove(pbVar22,pbVar21,sVar20 + 1);
                  local_b8 = (_Bool *)0x59edc7;
                  if (((byte)((*pbVar22 & 0xdf) + 0xbf) < 0x1a) && (pbVar22[1] == 0x3a))
                  goto LAB_0050b9a3;
                }
LAB_0050baa9:
                pcVar17 = (pcVar13->host).name;
                pcVar16 = strchr(pcVar17,0x40);
                pcVar14 = pcVar16 + 1;
                if (pcVar16 == (char *)0x0) {
                  pcVar14 = pcVar17;
                }
                pcVar17 = strchr(pcVar14,0x3f);
                bVar4 = pcVar17 != (char *)0x0;
                if (pcVar17 == (char *)0x0) {
                  bVar6 = *pbVar22;
                  if (bVar6 != 0) goto LAB_0050bb34;
                  pbVar22[0] = 0x2f;
                  pbVar22[1] = 0;
                  bVar4 = true;
LAB_0050bb69:
                  if ((data->set).path_as_is == false) {
                    pbVar21 = (byte *)Curl_dedotdotify((char *)pbVar22);
                    if (pbVar21 == (byte *)0x0) {
                      CVar8 = CURLE_OUT_OF_MEMORY;
                      in_connect = local_c8;
                      protocol_done = local_d0;
                      goto LAB_0050b5ae;
                    }
                    iVar9 = strcmp((char *)pbVar21,(char *)pbVar22);
                    if (iVar9 != 0) {
                      (*Curl_cfree)((data->state).pathbuffer);
                      (data->state).pathbuffer = (char *)pbVar21;
                      (data->state).path = (char *)pbVar21;
                      goto LAB_0050bbd3;
                    }
                    (*Curl_cfree)(pbVar21);
                  }
                  pbVar21 = pbVar22;
                  if (!bVar4) goto LAB_0050bd56;
                }
                else {
                  sVar20 = strlen(pcVar17);
                  sVar15 = strlen((char *)pbVar22);
                  memmove(pbVar22 + sVar20 + 1,pbVar22,sVar15 + 1);
                  memcpy(pbVar22 + 1,pcVar17,sVar20);
                  *pbVar22 = 0x2f;
                  *pcVar17 = '\0';
                  bVar6 = *pbVar22;
LAB_0050bb34:
                  if (bVar6 == 0x2f) goto LAB_0050bb69;
                  sVar20 = strlen((char *)pbVar22);
                  memmove(pbVar22 + 1,pbVar22,sVar20 + 1);
                  *pbVar22 = 0x2f;
                  pbVar21 = pbVar22;
                }
LAB_0050bbd3:
                local_80 = pbVar21;
                sVar20 = strlen((char *)pbVar21);
                sVar15 = strlen((pcVar13->host).name);
                first = local_b8;
                protocol_done = local_d0;
                if ((char)local_bc == '\0') {
                  local_60 = sVar20;
                  sVar20 = strlen(local_b8);
                  iVar9 = curl_strnequal(first,(data->change).url,sVar20);
                  if (iVar9 == 0) {
LAB_0050bd8d:
                    pcVar17 = "<url> malformed";
                    goto LAB_0050b7e7;
                  }
                  iVar9 = curl_strnequal("://",(data->change).url + sVar20,3);
                  if (iVar9 == 0) {
                    iVar9 = curl_strnequal("file:",(data->change).url,5);
                    if (iVar9 == 0) goto LAB_0050bd8d;
                    sVar15 = sVar15 + sVar20 + (ulong)((data->change).url[5] == '/') + 1;
                    sVar20 = local_60;
                  }
                  else {
                    sVar15 = sVar15 + sVar20 + 3;
                    sVar20 = local_60;
                  }
                }
                pcVar17 = (char *)(*Curl_cmalloc)(sVar15 + sVar20 + 1);
                if (pcVar17 != (char *)0x0) {
                  memcpy(pcVar17,(data->change).url,sVar15);
                  pbVar22 = local_80;
                  memcpy(pcVar17 + sVar15,local_80,sVar20 + 1);
                  if ((data->change).url_alloc == true) {
                    (*Curl_cfree)((data->change).url);
                    (data->change).url = (char *)0x0;
                    (data->change).url_alloc = false;
                  }
                  Curl_infof(data,"Rebuilt URL to: %s\n",pcVar17);
                  (data->change).url = pcVar17;
                  (data->change).url_alloc = true;
LAB_0050bd56:
                  pCVar28 = &Curl_handler_http;
                  ppCVar25 = protocols;
LAB_0050bd6b:
                  ppCVar25 = ppCVar25 + 1;
                  iVar9 = Curl_strcasecompare(pCVar28->scheme,local_b8);
                  if (iVar9 == 0) goto code_r0x0050bd7c;
                  if ((((uint)(data->set).allowed_protocols & pCVar28->protocol) != 0) &&
                     (((data->state).this_is_a_follow != true ||
                      (((uint)(data->set).redir_protocols & pCVar28->protocol) != 0)))) {
                    pcVar13->given = pCVar28;
                    pcVar13->handler = pCVar28;
                    CVar8 = CURLE_OK;
                    local_98 = (char *)0x0;
                    local_68 = (char *)0x0;
                    local_70 = (char *)0x0;
                    pcVar17 = (pcVar13->host).name;
                    local_80 = pbVar22;
                    pcVar14 = strchr(pcVar17,0x40);
                    if (pcVar14 != (char *)0x0) {
                      (pcVar13->host).name = pcVar14 + 1;
                      if ((data->set).use_netrc != CURL_NETRC_REQUIRED) {
                        optionsp_00 = &local_70;
                        if ((pCVar28->flags >> 10 & 1) == 0) {
                          optionsp_00 = (char **)0x0;
                        }
                        CVar8 = parse_login_details(pcVar17,(size_t)(pcVar14 + 1 + ~(ulong)pcVar17),
                                                    &local_98,&local_68,optionsp_00);
                        if (CVar8 == CURLE_OK) {
                          if (local_98 != (char *)0x0) {
                            (pcVar13->bits).userpwd_in_url = true;
                            (pcVar13->bits).user_passwd = true;
                            CVar8 = Curl_urldecode(data,local_98,0,&local_90,(size_t *)0x0,false);
                            if (CVar8 != CURLE_OK) goto LAB_0050bee2;
                            (*Curl_cfree)(local_a0);
                            local_a0 = local_90;
                          }
                          if (local_68 != (char *)0x0) {
                            CVar8 = Curl_urldecode(data,local_68,0,&local_90,(size_t *)0x0,false);
                            if (CVar8 != CURLE_OK) goto LAB_0050bee2;
                            (*Curl_cfree)(local_a8);
                            local_a8 = local_90;
                          }
                          if (local_70 == (char *)0x0) {
                            CVar8 = CURLE_OK;
                          }
                          else {
                            CVar8 = Curl_urldecode(data,local_70,0,&local_90,(size_t *)0x0,false);
                            if (CVar8 == CURLE_OK) {
                              (*Curl_cfree)(local_b0);
                              local_b0 = local_90;
                            }
                          }
                        }
                      }
                    }
LAB_0050bee2:
                    (*Curl_cfree)(local_98);
                    (*Curl_cfree)(local_68);
                    (*Curl_cfree)(local_70);
                    protocol_done = local_d0;
                    in_connect = local_c8;
                    if (CVar8 != CURLE_OK) goto LAB_0050b5ae;
                    pcVar17 = (pcVar13->host).name;
                    if ((*pcVar17 == '[') &&
                       (pbVar22 = (byte *)strchr(pcVar17,0x25), pbVar22 != (byte *)0x0)) {
                      iVar9 = *pbVar22 - 0x25;
                      if ((iVar9 == 0) && (iVar9 = pbVar22[1] - 0x32, iVar9 == 0)) {
                        iVar9 = 0x35 - (uint)pbVar22[2];
                      }
                      else {
                        iVar9 = -iVar9;
                      }
                      if (iVar9 == 0) {
                        lVar18 = 3;
                      }
                      else {
                        Curl_infof(data,"Please URL encode %% as %%25, see RFC 6874.\n");
                        lVar18 = 1;
                      }
                      uVar23 = strtoul((char *)(pbVar22 + lVar18),&local_98,10);
                      pcVar17 = local_98;
                      if (*local_98 == ']') {
                        sVar20 = strlen(local_98);
                        memmove(pbVar22,pcVar17,sVar20 + 1);
                        pcVar13->scope_id = (uint)uVar23;
                        protocol_done = local_d0;
                      }
                      else {
                        Curl_infof(data,"Invalid IPv6 address format\n");
                        protocol_done = local_d0;
                      }
                    }
                    uVar2 = (data->set).scope_id;
                    if (uVar2 != 0) {
                      pcVar13->scope_id = uVar2;
                    }
                    pcVar17 = strchr((char *)local_80,0x23);
                    if (pcVar17 != (char *)0x0) {
                      *pcVar17 = '\0';
                      pcVar17 = strchr((data->change).url,0x23);
                      if (pcVar17 != (char *)0x0) {
                        *pcVar17 = '\0';
                      }
                    }
                    if ((char)local_bc == '\0') goto LAB_0050c0d7;
                    pbVar22 = (byte *)curl_maprintf("%s://%s",pcVar13->handler->scheme,
                                                    (data->change).url);
                    in_connect = local_c8;
                    if (pbVar22 != (byte *)0x0) {
                      bVar6 = *pbVar22;
                      pbVar21 = pbVar22;
                      while (bVar6 != 0x3a) {
                        iVar9 = tolower((uint)bVar6);
                        *pbVar21 = (byte)iVar9;
                        bVar6 = pbVar21[1];
                        pbVar21 = pbVar21 + 1;
                      }
                      if ((data->change).url_alloc == true) {
                        (*Curl_cfree)((data->change).url);
                      }
                      (data->change).url = (char *)pbVar22;
                      (data->change).url_alloc = true;
                      protocol_done = local_d0;
LAB_0050c0d7:
                      if (((pcVar13->given->flags & 0x40) != 0) &&
                         (pcVar17 = strchr((pcVar13->data->state).path,0x3f), pcVar17 != (char *)0x0
                         )) {
                        *pcVar17 = '\0';
                      }
                      pcVar17 = (data->set).str[0x35];
                      if (pcVar17 == (char *)0x0) {
LAB_0050c123:
                        CVar8 = create_conn_helper_init_proxy(pcVar13);
                        in_connect = local_c8;
                        if (CVar8 != CURLE_OK) goto LAB_0050b5ae;
                        if (((pcVar13->given->flags & 1) != 0) &&
                           ((pcVar13->bits).httpproxy == true)) {
                          (pcVar13->bits).tunnel_proxy = true;
                        }
                        CVar8 = parse_remote_port(data,pcVar13);
                        in_connect = local_c8;
                        protocol_done = local_d0;
                        if ((((CVar8 != CURLE_OK) ||
                             (CVar8 = override_login(data,pcVar13,&local_a0,&local_a8,&local_b0),
                             in_connect = local_c8, protocol_done = local_d0, CVar8 != CURLE_OK)) ||
                            (CVar8 = set_login(pcVar13,local_a0,local_a8,local_b0),
                            in_connect = local_c8, protocol_done = local_d0, CVar8 != CURLE_OK)) ||
                           (CVar8 = parse_connect_to_slist(data,pcVar13,(data->set).connect_to),
                           in_connect = local_c8, protocol_done = local_d0, CVar8 != CURLE_OK))
                        goto LAB_0050b5ae;
                        fix_hostname((connectdata *)pcVar13->data,&pcVar13->host);
                        if ((pcVar13->bits).conn_to_host == true) {
                          fix_hostname((connectdata *)pcVar13->data,&pcVar13->conn_to_host);
                        }
                        if ((pcVar13->bits).httpproxy == true) {
                          fix_hostname((connectdata *)pcVar13->data,&(pcVar13->http_proxy).host);
                        }
                        if ((pcVar13->bits).socksproxy == true) {
                          fix_hostname((connectdata *)pcVar13->data,&(pcVar13->socks_proxy).host);
                        }
                        if (((pcVar13->bits).conn_to_host == true) &&
                           (iVar9 = Curl_strcasecompare((pcVar13->conn_to_host).name,
                                                        (pcVar13->host).name), iVar9 != 0)) {
                          (pcVar13->bits).conn_to_host = false;
                        }
                        cVar7 = (pcVar13->bits).conn_to_port;
                        if (((_Bool)cVar7 == true) &&
                           (pcVar13->conn_to_port == pcVar13->remote_port)) {
                          (pcVar13->bits).conn_to_port = false;
                          cVar7 = '\0';
                        }
                        if ((((pcVar13->bits).conn_to_host != false) || (cVar7 != '\0')) &&
                           ((pcVar13->bits).httpproxy == true)) {
                          (pcVar13->bits).tunnel_proxy = true;
                        }
                        CVar8 = setup_connection_internals(pcVar13);
                        in_connect = local_c8;
                        protocol_done = local_d0;
                        if (CVar8 != CURLE_OK) goto LAB_0050b5ae;
                        pcVar13->recv[0] = Curl_recv_plain;
                        pcVar13->send[0] = Curl_send_plain;
                        pcVar13->recv[1] = Curl_recv_plain;
                        pcVar13->send[1] = Curl_send_plain;
                        (pcVar13->bits).tcp_fastopen = (data->set).tcp_fastopen;
                        if ((pcVar13->handler->flags & 0x10) != 0) {
                          CVar10 = (*pcVar13->handler->connect_it)(pcVar13,local_48);
                          if (CVar10 == CURLE_OK) {
                            pcVar13->data = data;
                            (pcVar13->bits).tcpconnect[0] = true;
                            Curl_conncache_add_conn((data->state).conn_cache,pcVar13);
                            CVar8 = setup_range(data);
                            if (CVar8 != CURLE_OK) {
                              (*pcVar13->handler->done)(pcVar13,CVar8,false);
                              in_connect = local_c8;
                              protocol_done = local_d0;
                              goto LAB_0050b5ae;
                            }
                            Curl_setup_transfer(pcVar13,-1,-1,false,(curl_off_t *)0x0,-1,
                                                (curl_off_t *)0x0);
                          }
                          Curl_init_do(data,pcVar13);
                          in_connect = local_c8;
                          protocol_done = local_d0;
                          CVar8 = CVar10;
                          goto LAB_0050b5ae;
                        }
                        pcVar17 = (data->set).str[0x1b];
                        (data->set).ssl.primary.CApath = (data->set).str[0x1a];
                        (data->set).proxy_ssl.primary.CApath = pcVar17;
                        (data->set).ssl.primary.CAfile = (data->set).str[0x1c];
                        (data->set).proxy_ssl.primary.CAfile = (data->set).str[0x1d];
                        pcVar17 = (data->set).str[0x23];
                        (data->set).ssl.primary.random_file = pcVar17;
                        (data->set).proxy_ssl.primary.random_file = pcVar17;
                        pcVar17 = (data->set).str[0x22];
                        (data->set).ssl.primary.egdsocket = pcVar17;
                        (data->set).proxy_ssl.primary.egdsocket = pcVar17;
                        (data->set).ssl.primary.cipher_list = (data->set).str[0x20];
                        (data->set).proxy_ssl.primary.cipher_list = (data->set).str[0x21];
                        (data->set).ssl.CRLfile = (data->set).str[0x25];
                        (data->set).proxy_ssl.CRLfile = (data->set).str[0x26];
                        (data->set).ssl.issuercert = (data->set).str[0x27];
                        (data->set).proxy_ssl.issuercert = (data->set).str[0x28];
                        pcVar17 = (data->set).str[0];
                        pcVar14 = (data->set).str[1];
                        (data->set).ssl.cert = pcVar17;
                        (data->set).proxy_ssl.cert = pcVar14;
                        (data->set).ssl.cert_type = (data->set).str[2];
                        (data->set).proxy_ssl.cert_type = (data->set).str[3];
                        (data->set).ssl.key = (data->set).str[0xd];
                        (data->set).proxy_ssl.key = (data->set).str[0xe];
                        (data->set).ssl.key_type = (data->set).str[0x11];
                        (data->set).proxy_ssl.key_type = (data->set).str[0x12];
                        pcVar16 = (data->set).str[0x10];
                        (data->set).ssl.key_passwd = (data->set).str[0xf];
                        (data->set).proxy_ssl.key_passwd = pcVar16;
                        (data->set).ssl.primary.clientcert = pcVar17;
                        (data->set).proxy_ssl.primary.clientcert = pcVar14;
                        _Var5 = Curl_clone_primary_ssl_config
                                          (&(data->set).ssl.primary,&pcVar13->ssl_config);
                        in_connect = local_c8;
                        protocol_done = local_d0;
                        if (!_Var5) goto LAB_0050b5a9;
                        _Var5 = Curl_clone_primary_ssl_config
                                          (&(data->set).proxy_ssl.primary,&pcVar13->proxy_ssl_config
                                          );
                        in_connect = local_c8;
                        protocol_done = local_d0;
                        CVar8 = CURLE_OUT_OF_MEMORY;
                        if (!_Var5) goto LAB_0050b5ae;
                        prune_dead_connections(data);
                        if ((((data->set).reuse_fresh == true) &&
                            ((data->state).this_is_a_follow != true)) ||
                           (_Var5 = ConnectionExists(data,pcVar13,&local_50,&local_d1,&local_d2),
                           pcVar24 = local_50, !_Var5)) {
LAB_0050c602:
                          if ((pcVar13->handler->flags & 0x100) != 0) {
                            if ((data->set).ssl_enable_alpn == true) {
                              (pcVar13->bits).tls_enable_alpn = true;
                            }
                            if ((data->set).ssl_enable_npn == true) {
                              (pcVar13->bits).tls_enable_npn = true;
                            }
                          }
                          if (local_d2 != false) {
LAB_0050c640:
                            Curl_infof(data,"No connections available.\n");
                            conn_free(pcVar13);
                            *local_c8 = (connectdata *)0x0;
                            in_connect = local_c8;
                            protocol_done = local_d0;
                            CVar8 = CURLE_NO_CONNECTION_AVAILABLE;
                            goto LAB_0050b5ae;
                          }
                          pcVar27 = (data->state).conn_cache;
                          pCVar11 = (Curl_easy *)Curl_conncache_find_bundle(pcVar13,pcVar27);
                          if ((pCVar11 != (Curl_easy *)0x0 && local_88 != (Curl_easy *)0x0) &&
                             (local_88 <= pCVar11->prev)) {
                            pcVar24 = find_oldest_idle_connection_in_bundle
                                                (pCVar11,(connectbundle *)pcVar27);
                            if (pcVar24 == (connectdata *)0x0) {
                              Curl_infof(data,"No more connections allowed to host: %d\n",local_88);
                              goto LAB_0050c640;
                            }
                            pcVar24->data = data;
                            Curl_disconnect(pcVar24,false);
                          }
                          pcVar27 = (data->state).conn_cache;
                          if ((local_78 != 0) && (local_78 <= pcVar27->num_connections)) {
                            pcVar24 = Curl_oldest_idle_connection(data);
                            if (pcVar24 == (connectdata *)0x0) {
                              Curl_infof(data,"No connections available in cache\n");
                              goto LAB_0050c640;
                            }
                            pcVar24->data = data;
                            Curl_disconnect(pcVar24,false);
                            pcVar27 = (data->state).conn_cache;
                          }
                          Curl_conncache_add_conn(pcVar27,pcVar13);
                          if ((((data->state).authhost.picked & 0x28) != 0) &&
                             ((data->state).authhost.done == true)) {
                            Curl_infof(data,"NTLM picked AND auth done set, clear picked!\n");
                            (data->state).authhost.picked = 0;
                            (data->state).authhost.done = false;
                          }
                          if ((((data->state).authproxy.picked & 0x28) != 0) &&
                             ((data->state).authproxy.done == true)) {
                            Curl_infof(data,"NTLM-proxy picked AND auth done set, clear picked!\n");
                            (data->state).authproxy.picked = 0;
                            (data->state).authproxy.done = false;
                          }
                        }
                        else {
                          if (((local_d1 == false) &&
                              (iVar9 = IsPipeliningPossible(data,local_50), iVar9 != 0)) &&
                             (((pcVar24->recv_pipe).size + (pcVar24->send_pipe).size != 0 &&
                              ((Curl_infof(data,
                                           "Found connection %ld, with requests in the pipe (%zu)\n"
                                           ,pcVar24->connection_id),
                               (Curl_easy *)pcVar24->bundle->num_connections < local_88 &&
                               (((data->state).conn_cache)->num_connections < local_78)))))) {
                            Curl_infof(data,"We can reuse, but we want a new connection anyway\n");
                            goto LAB_0050c602;
                          }
                          pcVar24->inuse = true;
                          reuse_conn(pcVar13,pcVar24);
                          (*Curl_cfree)(pcVar13);
                          *local_c8 = pcVar24;
                          pcVar17 = "host";
                          if ((pcVar24->bits).proxy != false) {
                            pcVar17 = "proxy";
                          }
                          lVar18 = 0x128;
                          if (((pcVar24->socks_proxy).host.name == (char *)0x0) &&
                             (lVar18 = 0x168, (pcVar24->http_proxy).host.name == (char *)0x0)) {
                            lVar18 = 0xe0;
                          }
                          Curl_infof(data,"Re-using existing connection! (#%ld) with %s %s\n",
                                     pcVar24->connection_id,pcVar17,
                                     *(undefined8 *)((pcVar24->chunk).hexbuffer + lVar18 + -0x20));
                          pcVar13 = pcVar24;
                        }
                        pcVar13->inuse = true;
                        Curl_init_do(data,pcVar13);
                        CVar8 = setup_range(data);
                        in_connect = local_c8;
                        protocol_done = local_d0;
                        if (CVar8 == CURLE_OK) {
                          pcVar13->seek_func = (data->set).seek_func;
                          pcVar13->seek_client = (data->set).seek_client;
                          CVar8 = resolve_server(data,pcVar13,local_58);
                          in_connect = local_c8;
                          protocol_done = local_d0;
                        }
                        goto LAB_0050b5ae;
                      }
                      pcVar17 = (*Curl_cstrdup)(pcVar17);
                      pcVar13->oauth_bearer = pcVar17;
                      in_connect = local_c8;
                      if (pcVar17 != (char *)0x0) goto LAB_0050c123;
                    }
                    goto LAB_0050b5a9;
                  }
                  goto LAB_0050bf55;
                }
              }
              CVar8 = CURLE_OUT_OF_MEMORY;
              in_connect = local_c8;
              goto LAB_0050b5ae;
            }
            pcVar17 = "Bad URL, colon is first character";
          }
          else {
            pcVar17 = "Illegal characters found in URL";
          }
LAB_0050b7e7:
          Curl_failf(data,pcVar17);
          CVar8 = CURLE_URL_MALFORMAT;
          in_connect = local_c8;
          goto LAB_0050b5ae;
        }
      }
    }
  }
LAB_0050b5a9:
  CVar8 = CURLE_OUT_OF_MEMORY;
LAB_0050b5ae:
  (*Curl_cfree)(local_b0);
  (*Curl_cfree)(local_a8);
  (*Curl_cfree)(local_a0);
  if (CVar8 == CURLE_OK) {
    pcVar13 = *in_connect;
    if (((pcVar13->send_pipe).size != 0) || ((pcVar13->recv_pipe).size != 0)) {
      *protocol_done = true;
      return CURLE_OK;
    }
    if (*local_58 != false) {
      return CURLE_OK;
    }
    CVar8 = Curl_setup_conn(pcVar13,protocol_done);
  }
  if (CVar8 != CURLE_OK) {
    if (CVar8 == CURLE_NO_CONNECTION_AVAILABLE) {
      *in_connect = (connectdata *)0x0;
      CVar8 = CURLE_NO_CONNECTION_AVAILABLE;
    }
    else if (*in_connect != (connectdata *)0x0) {
      Curl_disconnect(*in_connect,false);
      *in_connect = (connectdata *)0x0;
    }
  }
  return CVar8;
code_r0x0050bd7c:
  pCVar28 = *ppCVar25;
  if (pCVar28 == (Curl_handler *)0x0) goto LAB_0050bf55;
  goto LAB_0050bd6b;
LAB_0050bf55:
  Curl_failf(data,"Protocol \"%s\" not supported or disabled in libcurl",local_b8);
  CVar8 = CURLE_UNSUPPORTED_PROTOCOL;
  in_connect = local_c8;
  protocol_done = local_d0;
  goto LAB_0050b5ae;
}

Assistant:

CURLcode Curl_connect(struct Curl_easy *data,
                      struct connectdata **in_connect,
                      bool *asyncp,
                      bool *protocol_done)
{
  CURLcode result;

  *asyncp = FALSE; /* assume synchronous resolves by default */

  /* call the stuff that needs to be called */
  result = create_conn(data, in_connect, asyncp);

  if(!result) {
    /* no error */
    if((*in_connect)->send_pipe.size || (*in_connect)->recv_pipe.size)
      /* pipelining */
      *protocol_done = TRUE;
    else if(!*asyncp) {
      /* DNS resolution is done: that's either because this is a reused
         connection, in which case DNS was unnecessary, or because DNS
         really did finish already (synch resolver/fast async resolve) */
      result = Curl_setup_conn(*in_connect, protocol_done);
    }
  }

  if(result == CURLE_NO_CONNECTION_AVAILABLE) {
    *in_connect = NULL;
    return result;
  }

  if(result && *in_connect) {
    /* We're not allowed to return failure with memory left allocated
       in the connectdata struct, free those here */
    Curl_disconnect(*in_connect, FALSE); /* close the connection */
    *in_connect = NULL;           /* return a NULL */
  }

  return result;
}